

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

path * __thiscall CPath::remove_filename_abi_cxx11_(CPath *this)

{
  string_type ns;
  
  std::__cxx11::string::string((string *)&ns,(string *)this);
  std::__cxx11::string::rfind((char)this,0x2f);
  std::__cxx11::string::resize((ulong)&ns);
  std::filesystem::__cxx11::path::assign<std::__cxx11::string>(&this->super_path,&ns);
  std::__cxx11::string::~string((string *)&ns);
  return &this->super_path;
}

Assistant:

path& remove_filename()
	{
		auto ns = native();

		ns.resize(native().find_last_of(preferred_separator) + 1);
		assign(ns);

		return *this;
	}